

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O0

void __thiscall
TApp_IncorrectConstructionOptionAsFlag_Test::TestBody
          (TApp_IncorrectConstructionOptionAsFlag_Test *this)

{
  bool bVar1;
  Option *pOVar2;
  AssertHelper local_e0;
  Message local_d8 [2];
  IncorrectConstruction *anon_var_0_1;
  char *pcStack_c0;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  Message local_b0 [2];
  IncorrectConstruction *anon_var_0;
  char *pcStack_98;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Message local_88;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  Option *local_20;
  Option *cat;
  TApp_IncorrectConstructionOptionAsFlag_Test *pTStack_10;
  int x;
  TApp_IncorrectConstructionOptionAsFlag_Test *this_local;
  
  pTStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"--cat",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"",&local_79);
  pOVar2 = CLI::App::add_option<int,_(CLI::detail::enabler)0>
                     (&(this->super_TApp).app,&local_40,(int *)((long)&cat + 4),&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_20 = pOVar2;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      CLI::Option::expected(local_20,1);
    }
  }
  else {
    testing::Message::Message(&local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x87,"Expected: cat->expected(1) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg,&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg);
    testing::Message::~Message(&local_88);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff68,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff68);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      CLI::Option::expected(local_20,0);
    }
    if ((anon_var_0._7_1_ & 1) != 0) goto LAB_00116e42;
    pcStack_98 = 
    "Expected: cat->expected(0) throws an exception of type CLI::IncorrectConstruction.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_b0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_msg_1,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
             ,0x88,pcStack_98);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_1,local_b0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_1);
  testing::Message::~Message(local_b0);
LAB_00116e42:
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff40,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff40);
  if (bVar1) {
    anon_var_0_1._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      CLI::Option::expected(local_20,2);
    }
    if ((anon_var_0_1._7_1_ & 1) != 0) {
      return;
    }
    pcStack_c0 = 
    "Expected: cat->expected(2) throws an exception of type CLI::IncorrectConstruction.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_d8);
  testing::internal::AssertHelper::AssertHelper
            (&local_e0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
             ,0x89,pcStack_c0);
  testing::internal::AssertHelper::operator=(&local_e0,local_d8);
  testing::internal::AssertHelper::~AssertHelper(&local_e0);
  testing::Message::~Message(local_d8);
  return;
}

Assistant:

TEST_F(TApp, IncorrectConstructionOptionAsFlag) {
    int x;
    auto cat = app.add_option("--cat", x);
    EXPECT_NO_THROW(cat->expected(1));
    EXPECT_THROW(cat->expected(0), CLI::IncorrectConstruction);
    EXPECT_THROW(cat->expected(2), CLI::IncorrectConstruction);
}